

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall QMetaStringTable::writeBlob(QMetaStringTable *this,char *out)

{
  byte bVar1;
  int i;
  Data *pDVar2;
  Span *pSVar3;
  Entry *pEVar4;
  ulong uVar5;
  int offsetOfStringdataMember;
  long in_FS_OFFSET;
  int stringdataOffset;
  piter local_40;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->m_entries).d;
  if (pDVar2 == (Data *)0x0) {
    offsetOfStringdataMember = 0;
  }
  else {
    offsetOfStringdataMember = (int)pDVar2->size << 3;
  }
  local_2c = 0;
  writeString(out,0,&this->m_className,offsetOfStringdataMember,&local_2c);
  local_40 = (piter)QHash<QByteArray,_int>::constBegin(&this->m_entries);
  while( true ) {
    if (local_40.d == (Data<QHashPrivate::Node<QByteArray,_int>_> *)0x0 && local_40.bucket == 0)
    break;
    pSVar3 = (local_40.d)->spans;
    uVar5 = local_40.bucket >> 7;
    pEVar4 = pSVar3[uVar5].entries;
    bVar1 = pSVar3[uVar5].offsets[(uint)local_40.bucket & 0x7f];
    i = *(int *)(pEVar4[bVar1].storage.data + 0x18);
    if (i != 0) {
      writeString(out,i,(QByteArray *)(pEVar4 + bVar1),offsetOfStringdataMember,&local_2c);
    }
    QHashPrivate::iterator<QHashPrivate::Node<QByteArray,_int>_>::operator++(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaStringTable::writeBlob(char *out) const
{
    Q_ASSERT(!(reinterpret_cast<quintptr>(out) & (preferredAlignment() - 1)));

    int offsetOfStringdataMember = int(m_entries.size() * 2 * sizeof(uint));
    int stringdataOffset = 0;

    // qt_metacast expects the first string in the string table to be the class name.
    writeString(out, /*index*/ 0, m_className, offsetOfStringdataMember, stringdataOffset);

    for (Entries::ConstIterator it = m_entries.constBegin(), end = m_entries.constEnd();
         it != end; ++it) {
        const int i = it.value();
        if (i == 0)
            continue;
        const QByteArray &str = it.key();

        writeString(out, i, str, offsetOfStringdataMember, stringdataOffset);
    }
}